

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdStarter.c
# Opt level: O3

void Cmd_RunStarter(char *pFileName,char *pBinary,char *pCommand,int nCores)

{
  bool bVar1;
  FILE *pFVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  FILE *__stream;
  size_t sVar6;
  byte *__s;
  void *__ptr;
  char *pcVar7;
  long lVar8;
  FILE *pFVar9;
  char *pcVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  timespec ts;
  timespec local_70;
  char *local_60;
  long local_58;
  size_t local_50;
  FILE *local_48;
  ulong local_40;
  char *local_38;
  
  iVar3 = clock_gettime(3,&local_70);
  if (iVar3 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  if (nCores < 2) {
    fprintf(_stdout,"The number of cores (%d) should be more than 1.\n",(ulong)(uint)nCores);
  }
  else {
    __stream = fopen(pFileName,"rb");
    if (__stream != (FILE *)0x0) {
      iVar12 = 0;
      iVar3 = 0;
      local_60 = pFileName;
      local_58 = lVar11;
      do {
        iVar13 = 0;
        do {
          iVar4 = fgetc(__stream);
          if (iVar4 == -1) {
            iVar4 = 0;
            iVar13 = 0;
            if (pBinary != (char *)0x0) {
              sVar6 = strlen(pBinary);
              iVar13 = (int)sVar6;
            }
            if (pCommand != (char *)0x0) {
              sVar6 = strlen(pCommand);
              iVar4 = (int)sVar6;
            }
            iVar4 = iVar3 * 2 + 100 + iVar13 + iVar4;
            local_50 = (size_t)iVar4;
            __s = (byte *)malloc(local_50);
            local_40 = (ulong)(iVar12 + 10);
            __ptr = malloc(local_40 * 8);
            if (pCommand == (char *)0x0) goto LAB_008874b6;
            rewind(__stream);
            pcVar7 = fgets((char *)__s,iVar4,__stream);
            if (pcVar7 == (char *)0x0) goto LAB_008874b6;
            goto LAB_00887444;
          }
          iVar13 = iVar13 + 1;
        } while (iVar4 != 10);
        iVar12 = iVar12 + 1;
        if (iVar3 <= iVar13) {
          iVar3 = iVar13;
        }
      } while( true );
    }
    fprintf(_stdout,"Input file \"%s\" cannot be opened.\n",pFileName);
  }
  return;
LAB_00887444:
  do {
    sVar6 = strlen((char *)__s);
    uVar5 = (int)sVar6 - 1;
    if (-1 < (int)uVar5) {
      lVar11 = (ulong)uVar5 + 1;
      do {
        if ((0x20 < (ulong)__s[lVar11 + -1]) ||
           ((0x100002600U >> ((ulong)__s[lVar11 + -1] & 0x3f) & 1) == 0)) break;
        __s[lVar11 + -1] = 0;
        lVar8 = lVar11 + -1;
        bVar1 = 0 < lVar11;
        lVar11 = lVar8;
      } while (lVar8 != 0 && bVar1);
    }
    if ((0x23 < (ulong)*__s) || ((0x900002601U >> ((ulong)*__s & 0x3f) & 1) == 0)) {
      pFVar9 = fopen((char *)__s,"rb");
      if (pFVar9 == (FILE *)0x0) {
        fprintf(_stdout,"Starter cannot open file \"%s\".\n",__s);
        fflush(_stdout);
      }
      fclose(pFVar9);
    }
    pcVar7 = fgets((char *)__s,iVar4,__stream);
  } while (pcVar7 != (char *)0x0);
LAB_008874b6:
  rewind(__stream);
  pcVar7 = fgets((char *)__s,iVar4,__stream);
  pFVar2 = __stream;
  pFVar9 = local_48;
  do {
    local_48 = pFVar2;
    if (pcVar7 == (char *)0x0) {
      local_48 = pFVar9;
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      if (__s != (byte *)0x0) {
        free(__s);
      }
      fclose(__stream);
      while( true ) {
        iVar12 = pthread_mutex_lock((pthread_mutex_t *)&mutex);
        iVar3 = nThreadsRunning;
        if (iVar12 != 0) {
          __assert_fail("status == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                        ,0xed,"void Cmd_RunStarter(char *, char *, char *, int)");
        }
        iVar12 = pthread_mutex_unlock((pthread_mutex_t *)&mutex);
        if (iVar12 != 0) break;
        if (iVar3 == 0) {
          fprintf(_stdout,"Finished processing commands in file \"%s\".  ",local_60);
          iVar12 = 3;
          iVar3 = clock_gettime(3,&local_70);
          if (iVar3 < 0) {
            lVar11 = -1;
          }
          else {
            lVar11 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
          }
          lVar11 = lVar11 + local_58;
          Abc_Print(iVar12,"%s =","Total wall time");
          Abc_Print(iVar12,"%9.2f sec\n",(double)lVar11 / 1000000.0);
          fflush(_stdout);
        }
      }
      __assert_fail("status == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cmd/cmdStarter.c"
                    ,0xef,"void Cmd_RunStarter(char *, char *, char *, int)");
    }
    sVar6 = strlen((char *)__s);
    uVar5 = (int)sVar6 - 1;
    if (-1 < (int)uVar5) {
      lVar11 = (ulong)uVar5 + 1;
      do {
        if ((0x20 < (ulong)__s[lVar11 + -1]) ||
           ((0x100002600U >> ((ulong)__s[lVar11 + -1] & 0x3f) & 1) == 0)) break;
        __s[lVar11 + -1] = 0;
        lVar8 = lVar11 + -1;
        bVar1 = 0 < lVar11;
        lVar11 = lVar8;
      } while (lVar8 != 0 && bVar1);
    }
    if ((0x23 < (ulong)*__s) || ((0x900002601U >> ((ulong)*__s & 0x3f) & 1) == 0)) {
      if (pCommand == (char *)0x0) {
        sVar6 = strlen((char *)__s);
        pcVar7 = (char *)malloc(sVar6 + 1);
        strcpy(pcVar7,(char *)__s);
      }
      else {
        pcVar7 = (char *)malloc(local_50);
        pcVar10 = Extra_FileNameGenericAppend((char *)__s,".txt");
        sprintf(pcVar7,"%s -c \"%s; %s\" > %s",pBinary,__s,pCommand,pcVar10);
      }
      local_38 = pcVar7;
      fprintf(_stdout,"Calling:  %s\n",pcVar7);
      fflush(_stdout);
    }
    pcVar7 = fgets((char *)__s,iVar4,__stream);
    pFVar2 = local_48;
    pFVar9 = local_48;
  } while( true );
}

Assistant:

void Cmd_RunStarter( char * pFileName, char * pBinary, char * pCommand, int nCores )
{
    FILE * pFile, * pFileTemp;
    pthread_t * pThreadIds;
    char * BufferCopy, * Buffer;
    int nLines, LineMax, Line, Len;
    int i, c, status, Counter;
    abctime clk = Abc_Clock();

    // check the number of cores
    if ( nCores < 2 )
    {
        fprintf( stdout, "The number of cores (%d) should be more than 1.\n", nCores ); 
        return; 
    }

    // open the file and make sure it is available
    pFile = fopen( pFileName, "rb" );
    if ( pFile == NULL )
    { 
        fprintf( stdout, "Input file \"%s\" cannot be opened.\n", pFileName ); 
        return; 
    }

    // count the number of lines and the longest line
    nLines = LineMax = Line = 0;
    while ( (c = fgetc(pFile)) != EOF )
    {
        Line++;
        if ( c != '\n' )
            continue;
        nLines++;
        LineMax = Abc_MaxInt( LineMax, Line );
        Line = 0;       
    }
    nLines += 10;
    LineMax += LineMax + 100;
    LineMax += pBinary  ? strlen(pBinary) : 0;
    LineMax += pCommand ? strlen(pCommand) : 0;

    // allocate storage
    Buffer = ABC_ALLOC( char, LineMax );
    pThreadIds = ABC_ALLOC( pthread_t, nLines );

    // check if all files can be opened
    if ( pCommand != NULL )
    {
        // read file names
        rewind( pFile );
        for ( i = 0; fgets( Buffer, LineMax, pFile ) != NULL; i++ )
        {
            // remove trailing spaces
            for ( Len = strlen(Buffer) - 1; Len >= 0; Len-- )
                if ( Buffer[Len] == '\n' || Buffer[Len] == '\r' || Buffer[Len] == '\t' || Buffer[Len] == ' ' )
                    Buffer[Len] = 0;
                else
                    break;

            // get command from file
            if ( Buffer[0] == 0 || Buffer[0] == '\n' || Buffer[0] == '\r' || Buffer[0] == '\t' || Buffer[0] == ' ' || Buffer[0] == '#' )
                continue;

            // try to open the file
            pFileTemp = fopen( Buffer, "rb" );
            if ( pFileTemp == NULL )
            {
                fprintf( stdout, "Starter cannot open file \"%s\".\n", Buffer );
                fflush( stdout );
                ABC_FREE( pThreadIds );
                ABC_FREE( Buffer );
                fclose( pFile );
                return;
            }
            fclose( pFileTemp );
        }
    } 
 
    // read commands and execute at most <num> of them at a time
    rewind( pFile );
    for ( i = 0; fgets( Buffer, LineMax, pFile ) != NULL; i++ )
    {
        // remove trailing spaces
        for ( Len = strlen(Buffer) - 1; Len >= 0; Len-- )
            if ( Buffer[Len] == '\n' || Buffer[Len] == '\r' || Buffer[Len] == '\t' || Buffer[Len] == ' ' )
                Buffer[Len] = 0;
            else
                break;

        // get command from file
        if ( Buffer[0] == 0 || Buffer[0] == '\n' || Buffer[0] == '\r' || Buffer[0] == '\t' || Buffer[0] == ' ' || Buffer[0] == '#' )
            continue;

        // create command
        if ( pCommand != NULL )
        {
            BufferCopy = ABC_ALLOC( char, LineMax );
            sprintf( BufferCopy, "%s -c \"%s; %s\" > %s", pBinary, Buffer, pCommand, Extra_FileNameGenericAppend(Buffer, ".txt") );
        }
        else
            BufferCopy = Abc_UtilStrsav( Buffer );
        fprintf( stdout, "Calling:  %s\n", (char *)BufferCopy );  
        fflush( stdout );

        // wait till there is an empty thread
        while ( 1 )
        {
            status = pthread_mutex_lock(&mutex);   assert(status == 0);
            Counter = nThreadsRunning;
            status = pthread_mutex_unlock(&mutex); assert(status == 0);
            if ( Counter < nCores - 1 )
                break;
//            Sleep( 100 );
        }

        // increament the number of threads running
        status = pthread_mutex_lock(&mutex);   assert(status == 0);
        nThreadsRunning++;
        status = pthread_mutex_unlock(&mutex); assert(status == 0);

        // create thread to execute this command
        status = pthread_create( &pThreadIds[i], NULL, Abc_RunThread, (void *)BufferCopy );  assert(status == 0);
        assert( i < nLines );
    }
    ABC_FREE( pThreadIds );
    ABC_FREE( Buffer );
    fclose( pFile );

    // wait for all the threads to finish
    while ( 1 )
    {
        status = pthread_mutex_lock(&mutex);   assert(status == 0);
        Counter = nThreadsRunning;
        status = pthread_mutex_unlock(&mutex); assert(status == 0);
        if ( Counter == 0 )
            break;
    }

    // cleanup
//    status = pthread_mutex_destroy(&mutex);   assert(status == 0);
//    mutex = PTHREAD_MUTEX_INITIALIZER;
    fprintf( stdout, "Finished processing commands in file \"%s\".  ", pFileName );
    Abc_PrintTime( 1, "Total wall time", Abc_Clock() - clk );
    fflush( stdout );
}